

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

void Js::CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
               (JavascriptString *s,Builder<256U> *toString,bool appendChars)

{
  char16 c_00;
  code *pcVar1;
  bool bVar2;
  charcount_t appendCharLength_00;
  undefined4 *puVar3;
  char16 *pcVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  undefined8 in_R9;
  char16_t *local_38;
  char16 *appendBuffer;
  char16 c;
  CharCount appendCharLength;
  bool appendChars_local;
  Builder<256U> *toString_local;
  JavascriptString *s_local;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ec,"(s)","s");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ed,"(toString)","toString");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Builder<256U>::IsFinalized(toString);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ee,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Builder<256U>::OwnsLastBlock(toString);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3ef,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((appendChars) && (bVar2 = Builder<256U>::HasOnlyDirectChars(toString), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3f0,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  appendCharLength_00 = JavascriptString::GetLength(s);
  if (appendCharLength_00 == 0) {
    return;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
  if (bVar2) {
    bVar2 = JavascriptString::IsFinalized(s);
    if (bVar2) {
      local_38 = JavascriptString::GetString(s);
    }
    else {
      local_38 = L"";
    }
    bVar2 = JavascriptString::IsFinalized(s);
    pcVar5 = L"";
    if (!bVar2 || 8 < appendCharLength_00) {
      pcVar5 = L"...";
    }
    pcVar6 = L"false";
    if (appendChars) {
      pcVar6 = L"true";
    }
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"
                  ,local_38,pcVar5,(ulong)appendCharLength_00,pcVar6,in_R9,local_38);
    Output::Flush();
  }
  if ((appendChars) || (bVar2 = Builder<256U>::HasOnlyDirectChars(toString), bVar2)) {
    if (appendCharLength_00 == 1) {
      pcVar4 = Builder<256U>::GetAppendStringBuffer(toString,s);
      c_00 = *pcVar4;
      bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(c_00,toString);
      if (bVar2) {
        return;
      }
      Builder<256U>::AppendSlow(toString,c_00);
      return;
    }
    if ((appendChars) || (bVar2 = Block::ShouldAppendChars(appendCharLength_00,0), bVar2)) {
      pcVar4 = Builder<256U>::GetAppendStringBuffer(toString,s);
      if (appendChars) {
        bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar4,appendCharLength_00,toString);
        if (bVar2) {
          return;
        }
      }
      else {
        bVar2 = TryAppendFewCharsGeneric<Js::CompoundString::Builder<256u>>
                          (pcVar4,appendCharLength_00,toString);
        if (bVar2) {
          return;
        }
      }
      Builder<256U>::AppendSlow(toString,pcVar4,appendCharLength_00);
      return;
    }
    Builder<256U>::SwitchToPointerMode(toString);
  }
  bVar2 = TryAppendGeneric<Js::CompoundString::Builder<256u>>(s,appendCharLength_00,toString);
  if (!bVar2) {
    Builder<256U>::AppendSlow(toString,s);
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        const CharCount appendCharLength = s->GetLength();
        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.8s%s\", appendCharLength = %u, appendChars = %s)\n"),
                s->IsFinalized() ? s->GetString() : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[0];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength))
            {
                const char16 *const appendBuffer = toString->GetAppendStringBuffer(s);
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(TryAppendGeneric(s, appendCharLength, toString))
            return;
        toString->AppendSlow(s);
    }